

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O2

Variable<double> * yyml::nn::MM<double>(Variable<double> *va,Variable<double> *vb)

{
  Variable<double> *result;
  initializer_list<unsigned_long> dims;
  TensorShape shape;
  unsigned_long local_28;
  unsigned_long local_20;
  
  local_28 = *(va->values_).shape_.dims.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_20 = (vb->values_).shape_.dims.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[1];
  dims._M_len = 2;
  dims._M_array = &local_28;
  TensorShape::TensorShape(&shape,dims);
  result = Factory<yyml::nn::Variable<double>>::GetNewInstance<yyml::TensorShape&>(&shape);
  MM<double>(va,vb,result);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return result;
}

Assistant:

Variable<Type>* MM(Variable<Type>* va, Variable<Type>* vb) {
  size_t m = va->values_.shape().dims[0], n = vb->values_.shape().dims[1],
         p = va->values_.shape().dims[1];
  TensorShape shape = {m, n};
  auto* result = Variable<Type>::factory::GetNewInstance(shape);
  MM(va, vb, result);
  return result;
}